

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

filetime_t __thiscall FileSystemUtils::Path::GetLastWriteTime(Path *this)

{
  int iVar1;
  stat buffer;
  stat local_90;
  
  iVar1 = stat((this->m_string)._M_dataplus._M_p,&local_90);
  if (iVar1 != 0) {
    local_90.st_mtim.tv_sec = 0;
  }
  return local_90.st_mtim.tv_sec;
}

Assistant:

inline filetime_t Path::GetLastWriteTime()	const
	{
		filetime_t lastwritetime = 0;
		int error = -1;
#ifdef _WIN32
		struct _stat64 buffer;
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		error = _wstat64( temp.c_str(), &buffer );
#else
		struct stat buffer;
		error = stat( c_str(), &buffer );
#endif
		if( 0 == error )
		{
			lastwritetime = buffer.st_mtime;
		}
		return lastwritetime;
	}